

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

int ecc_config_get(igsc_device_handle *handle)

{
  uint uVar1;
  long in_FS_OFFSET;
  uint local_28;
  uint retries;
  int ret;
  igsc_device_handle *handle_local;
  uint8_t pen_ecc_state;
  long lStack_10;
  uint8_t cur_ecc_state;
  
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  handle_local._7_1_ = 0xff;
  handle_local._6_1_ = 0xff;
  local_28 = 0;
  do {
    uVar1 = igsc_ecc_config_get(handle,(long)&handle_local + 7,(long)&handle_local + 6);
    if (uVar1 != 0xd) break;
    gsc_msleep(2000);
    local_28 = local_28 + 1;
  } while (local_28 < 3);
  if (uVar1 == 0) {
    if ((quiet & 1U) == 0) {
      fprintf(_stdout,"Current ECC State: %u\n",(ulong)handle_local._7_1_);
    }
    if ((quiet & 1U) == 0) {
      fprintf(_stdout,"Pending ECC State: %u\n",(ulong)handle_local._6_1_);
    }
  }
  else {
    if ((quiet & 1U) == 0) {
      fprintf(_stderr,"Error: Failed to get ECC config, return code %d\n",(ulong)uVar1);
    }
    print_device_fw_status(handle);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_10) {
    __stack_chk_fail();
  }
  return uVar1;
}

Assistant:

mockable_static
int ecc_config_get(struct igsc_device_handle *handle)
{
    int     ret;
    uint8_t cur_ecc_state = 0xFF;
    uint8_t pen_ecc_state = 0xFF;
    unsigned int retries = 0;

    while ((ret = igsc_ecc_config_get(handle, &cur_ecc_state, &pen_ecc_state)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret)
    {
        fwupd_error("Failed to get ECC config, return code %d\n", ret);
        print_device_fw_status(handle);
    }
    else
    {
	    fwupd_msg("Current ECC State: %u\n", cur_ecc_state);
	    fwupd_msg("Pending ECC State: %u\n", pen_ecc_state);
    }
    return ret;
}